

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VScaleAddMulti(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  _func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  UNRECOVERED_JUMPTABLE = x->ops->nvscaleaddmulti;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0)
  {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,a,x,Y,Z);
    return iVar1;
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)nvec;
  if (nvec < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (*x->ops->nvlinearsum)(a[uVar2],x,1.0,Y[uVar2],Z[uVar2]);
  }
  return 0;
}

Assistant:

int N_VScaleAddMulti(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int i;
  realtype ONE=RCONST(1.0);

  if (x->ops->nvscaleaddmulti != NULL) {
    
    return(x->ops->nvscaleaddmulti(nvec, a, x, Y, Z));

  } else {

    for (i=0; i<nvec; i++) {
      x->ops->nvlinearsum(a[i], x, ONE, Y[i], Z[i]);
    }
    return(0);

  }
}